

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joint.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Joint::unkeyframe(Joint *this,double t)

{
  bool bVar1;
  reference ppJVar2;
  Joint *j;
  iterator __end2;
  iterator __begin2;
  vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_> *__range2;
  double t_local;
  Joint *this_local;
  
  Spline<CMU462::Vector3D>::removeKnot(&(this->super_SceneObject).positions,t,0.1);
  Spline<CMU462::Vector3D>::removeKnot(&(this->super_SceneObject).rotations,t,0.1);
  Spline<CMU462::Vector3D>::removeKnot(&(this->super_SceneObject).scales,t,0.1);
  __end2 = std::
           vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>::
           begin(&this->kids);
  j = (Joint *)std::
               vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
               ::end(&this->kids);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
                                *)&j);
    if (!bVar1) break;
    ppJVar2 = __gnu_cxx::
              __normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
              ::operator*(&__end2);
    unkeyframe(*ppJVar2,t);
    __gnu_cxx::
    __normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void Joint::unkeyframe(double t) {
     positions.removeKnot(t, 0.1);
     rotations.removeKnot(t, 0.1);
     scales.removeKnot(t, 0.1);
     for (Joint *j : kids) j->unkeyframe(t);
   }